

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O2

REF_STATUS ref_metric_parse_to_node(REF_GRID_conflict ref_grid,int argc,char **argv)

{
  REF_NODE ref_node;
  uint uVar1;
  REF_DBL *metric;
  undefined8 uVar2;
  REF_STATUS RVar3;
  ulong uVar4;
  char *pcVar5;
  
  ref_node = ref_grid->node;
  if (ref_node->max < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0xd94,
           "ref_metric_parse_to_node","malloc metric of REF_DBL negative");
    RVar3 = 1;
  }
  else {
    metric = (REF_DBL *)malloc((ulong)(uint)ref_node->max * 0x30);
    if (metric == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0xd94,"ref_metric_parse_to_node","malloc metric of REF_DBL NULL");
      RVar3 = 2;
    }
    else {
      uVar1 = ref_metric_from_node(metric,ref_node);
      if (uVar1 == 0) {
        uVar1 = ref_metric_parse(metric,ref_grid,argc,argv);
        if (uVar1 == 0) {
          uVar1 = ref_metric_to_node(metric,ref_node);
          if (uVar1 == 0) {
            free(metric);
            return 0;
          }
          uVar4 = (ulong)uVar1;
          pcVar5 = "to";
          uVar2 = 0xd97;
        }
        else {
          uVar4 = (ulong)uVar1;
          pcVar5 = "parse uniform";
          uVar2 = 0xd96;
        }
      }
      else {
        uVar4 = (ulong)uVar1;
        pcVar5 = "from";
        uVar2 = 0xd95;
      }
      RVar3 = (REF_STATUS)uVar4;
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             uVar2,"ref_metric_parse_to_node",uVar4,pcVar5);
    }
  }
  return RVar3;
}

Assistant:

REF_FCN REF_STATUS ref_metric_parse_to_node(REF_GRID ref_grid, int argc,
                                            char *argv[]) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_DBL *metric;
  ref_malloc(metric, 6 * ref_node_max(ref_node), REF_DBL);
  RSS(ref_metric_from_node(metric, ref_node), "from");
  RSS(ref_metric_parse(metric, ref_grid, argc, argv), "parse uniform");
  RSS(ref_metric_to_node(metric, ref_node), "to");
  ref_free(metric);
  return REF_SUCCESS;
}